

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep.c
# Opt level: O0

int lsrkStep_TakeStepSSP43(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 uVar4;
  sunrealtype p5;
  sunrealtype rs;
  N_Vector *Xvecs;
  sunrealtype *cvals;
  ARKodeLSRKStepMem step_mem;
  int retval;
  ARKodeLSRKStepMem *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  double dVar5;
  ARKodeMem in_stack_ffffffffffffffb8;
  double dVar6;
  undefined8 *local_30;
  int local_4;
  
  *in_RDX = 0;
  *in_RSI = 0;
  local_4 = lsrkStep_AccessStepMem
                      (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8
                      );
  if (local_4 == 0) {
    puVar1 = (undefined8 *)local_30[0x12];
    puVar2 = (undefined8 *)local_30[0x13];
    dVar6 = 4.0;
    dVar5 = 0.5;
    if (*(int *)(in_RDI + 0x260) == 0) {
      iVar3 = (*(code *)*local_30)
                        (*(undefined8 *)(in_RDI + 0x380),*(undefined8 *)(in_RDI + 0x250),
                         *(undefined8 *)(in_RDI + 600),*(undefined8 *)(in_RDI + 0x10));
      local_30[4] = local_30[4] + 1;
      *(undefined4 *)(in_RDI + 0x260) = 1;
      if (iVar3 != 0) {
        return -8;
      }
    }
    N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * dVar5,
                 *(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 600),
                 *(undefined8 *)(in_RDI + 0x248));
    if (*(int *)(in_RDI + 0x300) == 0) {
      N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / dVar6,
                   *(undefined8 *)(in_RDI + 0x250),*(undefined8 *)(in_RDI + 600),
                   *(undefined8 *)(in_RDI + 0x268));
    }
    if ((*(long *)(in_RDI + 0x400) == 0) ||
       (iVar3 = (**(code **)(in_RDI + 0x400))
                          (*(double *)(in_RDI + 0x2c0) * dVar5 + *(double *)(in_RDI + 0x380),
                           *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x10)),
       iVar3 == 0)) {
      iVar3 = (*(code *)*local_30)
                        (*(double *)(in_RDI + 0x2c0) * dVar5 + *(double *)(in_RDI + 0x2f0),
                         *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                         *(undefined8 *)(in_RDI + 0x10));
      local_30[4] = local_30[4] + 1;
      if (iVar3 < 0) {
        local_4 = -8;
      }
      else if (iVar3 < 1) {
        N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * dVar5,
                     *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                     *(undefined8 *)(in_RDI + 0x248));
        if (*(int *)(in_RDI + 0x300) == 0) {
          N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / dVar6,
                       *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x278),
                       *(undefined8 *)(in_RDI + 0x268));
        }
        if ((*(long *)(in_RDI + 0x400) == 0) ||
           (iVar3 = (**(code **)(in_RDI + 0x400))
                              (*(double *)(in_RDI + 0x2f0) + *(double *)(in_RDI + 0x2c0),
                               *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x10)),
           iVar3 == 0)) {
          iVar3 = (*(code *)*local_30)
                            (*(double *)(in_RDI + 0x2f0) + *(double *)(in_RDI + 0x2c0),
                             *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                             *(undefined8 *)(in_RDI + 0x10));
          local_30[4] = local_30[4] + 1;
          if (iVar3 < 0) {
            local_4 = -8;
          }
          else if (iVar3 < 1) {
            *puVar1 = 0x3fd5555555555555;
            *puVar2 = *(undefined8 *)(in_RDI + 0x248);
            puVar1[1] = 0x3fe5555555555555;
            puVar2[1] = *(undefined8 *)(in_RDI + 0x250);
            puVar1[2] = *(double *)(in_RDI + 0x2c0) * 0.16666666666666666;
            puVar2[2] = *(undefined8 *)(in_RDI + 0x278);
            iVar3 = N_VLinearCombination(3,puVar1,puVar2,*(undefined8 *)(in_RDI + 0x248));
            if (iVar3 == 0) {
              if (*(int *)(in_RDI + 0x300) == 0) {
                N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / dVar6,
                             *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x278),
                             *(undefined8 *)(in_RDI + 0x268));
              }
              if ((*(long *)(in_RDI + 0x400) == 0) ||
                 (iVar3 = (**(code **)(in_RDI + 0x400))
                                    (*(double *)(in_RDI + 0x2c0) * dVar5 +
                                     *(double *)(in_RDI + 0x2f0),*(undefined8 *)(in_RDI + 0x248),
                                     *(undefined8 *)(in_RDI + 0x10)), iVar3 == 0)) {
                iVar3 = (*(code *)*local_30)
                                  (*(double *)(in_RDI + 0x2c0) * dVar5 + *(double *)(in_RDI + 0x2f0)
                                   ,*(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                                   *(undefined8 *)(in_RDI + 0x10));
                local_30[4] = local_30[4] + 1;
                if (iVar3 < 0) {
                  local_4 = -8;
                }
                else if (iVar3 < 1) {
                  N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) * dVar5,
                               *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x278),
                               *(undefined8 *)(in_RDI + 0x248));
                  if (*(int *)(in_RDI + 0x300) == 0) {
                    N_VLinearSum(0x3ff0000000000000,*(double *)(in_RDI + 0x2c0) / dVar6,
                                 *(undefined8 *)(in_RDI + 0x268),*(undefined8 *)(in_RDI + 0x278),
                                 *(undefined8 *)(in_RDI + 0x268));
                    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,
                                 *(undefined8 *)(in_RDI + 0x248),*(undefined8 *)(in_RDI + 0x268),
                                 *(undefined8 *)(in_RDI + 0x268));
                    uVar4 = N_VWrmsNorm(*(undefined8 *)(in_RDI + 0x268),
                                        *(undefined8 *)(in_RDI + 0x230));
                    *in_RSI = uVar4;
                  }
                  local_4 = 0;
                }
                else {
                  local_4 = 9;
                }
              }
              else {
                local_4 = -0x26;
              }
            }
            else {
              local_4 = -0x1c;
            }
          }
          else {
            local_4 = 9;
          }
        }
        else {
          local_4 = -0x26;
        }
      }
      else {
        local_4 = 9;
      }
    }
    else {
      local_4 = -0x26;
    }
  }
  return local_4;
}

Assistant:

int lsrkStep_TakeStepSSP43(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  int retval;
  ARKodeLSRKStepMem step_mem;

  /* initialize algebraic solver convergence flag to success,
     temporal error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr   = ZERO;

  /* access ARKodeLSRKStepMem structure */
  retval = lsrkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  sunrealtype* cvals = step_mem->cvals;
  N_Vector* Xvecs    = step_mem->Xvecs;

  sunrealtype rs = SUN_RCONST(4.0);
  sunrealtype p5 = SUN_RCONST(0.5);

  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 0,
             ark_mem->tcur);
  SUNLogExtraDebugVec(ARK_LOGGER, "stage", ark_mem->yn, "z_0(:) =");

  /* The method is not FSAL. Therefore, fn ​is computed at the beginning
     of the step unless ARKODE updated fn. */
  if (!ark_mem->fn_is_current)
  {
    retval = step_mem->fe(ark_mem->tn, ark_mem->yn, ark_mem->fn,
                          ark_mem->user_data);
    step_mem->nfe++;
    ark_mem->fn_is_current = SUNTRUE;
    if (retval != ARK_SUCCESS)
    {
      SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed rhs eval, retval = %i", retval);
      return (ARK_RHSFUNC_FAIL);
    }
  }

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->fn, "F_0(:) =");
  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 1,
             ark_mem->tn + p5 * ark_mem->h);

  N_VLinearSum(ONE, ark_mem->yn, ark_mem->h * p5, ark_mem->fn, ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->yn, ark_mem->h / rs, ark_mem->fn, ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tn + ark_mem->h * p5, ark_mem->ycur,
                                   ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  retval = step_mem->fe(ark_mem->tcur + ark_mem->h * p5, ark_mem->ycur,
                        ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3, "F_1(:) =");
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 2,
             ark_mem->tn + ark_mem->h);

  N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * p5, ark_mem->tempv3,
               ark_mem->ycur);
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                                   ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  retval = step_mem->fe(ark_mem->tcur + ark_mem->h, ark_mem->ycur,
                        ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3, "F_2(:) =");
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G, 3,
             ark_mem->tn + p5 * ark_mem->h);

  cvals[0] = ONE / THREE;
  Xvecs[0] = ark_mem->ycur;
  cvals[1] = TWO / THREE;
  Xvecs[1] = ark_mem->yn;
  cvals[2] = ONE / SIX * ark_mem->h;
  Xvecs[2] = ark_mem->tempv3;

  retval = N_VLinearCombination(3, cvals, Xvecs, ark_mem->ycur);
  if (retval != 0)
  {
    SUNLogInfo(ARK_LOGGER, "end-stage",
               "status = failed vector op, retval = %i", retval);
    return ARK_VECTOROP_ERR;
  }

  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
  }

  /* apply user-supplied stage postprocessing function (if supplied) */
  if (ark_mem->ProcessStage != NULL)
  {
    retval = ark_mem->ProcessStage(ark_mem->tcur + ark_mem->h * p5,
                                   ark_mem->ycur, ark_mem->user_data);
    if (retval != 0)
    {
      SUNLogInfo(ARK_LOGGER, "end-stage",
                 "status = failed postprocess stage, retval = %i", retval);
      return ARK_POSTPROCESS_STAGE_FAIL;
    }
  }

  retval = step_mem->fe(ark_mem->tcur + ark_mem->h * p5, ark_mem->ycur,
                        ark_mem->tempv3, ark_mem->user_data);
  step_mem->nfe++;

  SUNLogExtraDebugVec(ARK_LOGGER, "stage RHS", ark_mem->tempv3, "F_3(:) =");
  SUNLogInfoIf(retval != 0, ARK_LOGGER, "end-stage",
               "status = failed rhs eval, retval = %i", retval);

  if (retval < 0) { return ARK_RHSFUNC_FAIL; }
  if (retval > 0) { return RHSFUNC_RECVR; }

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogInfo(ARK_LOGGER, "begin-stage", "stage = %i, tcur = " SUN_FORMAT_G,
             step_mem->req_stages, ark_mem->tn + ark_mem->h);

  N_VLinearSum(ONE, ark_mem->ycur, ark_mem->h * p5, ark_mem->tempv3,
               ark_mem->ycur);

  SUNLogInfo(ARK_LOGGER, "end-stage", "status = success");
  SUNLogExtraDebugVec(ARK_LOGGER, "updated solution", ark_mem->ycur, "ycur(:) =");

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep)
  {
    N_VLinearSum(ONE, ark_mem->tempv1, ark_mem->h / rs, ark_mem->tempv3,
                 ark_mem->tempv1);
    SUNLogExtraDebugVec(ARK_LOGGER, "embedded solution", ark_mem->tempv1,
                        "y_embedded(:) =");

    N_VLinearSum(ONE, ark_mem->ycur, -ONE, ark_mem->tempv1, ark_mem->tempv1);
    *dsmPtr = N_VWrmsNorm(ark_mem->tempv1, ark_mem->ewt);
  }

  return ARK_SUCCESS;
}